

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ScaleWindowsInViewport(ImGuiViewportP *viewport,float scale)

{
  uint uVar1;
  ImGuiWindow *window;
  ImGuiContext *pIVar2;
  ulong uVar3;
  ulong uVar4;
  
  pIVar2 = GImGui;
  if (viewport->Window != (ImGuiWindow *)0x0) {
    ScaleWindow(viewport->Window,scale);
    return;
  }
  uVar1 = (GImGui->Windows).Size;
  uVar3 = (ulong)uVar1;
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      if ((long)(int)uVar3 <= (long)uVar4) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                      ,0x706,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      window = (pIVar2->Windows).Data[uVar4];
      if (window->Viewport == viewport) {
        ScaleWindow(window,scale);
      }
      uVar4 = uVar4 + 1;
      uVar3 = (ulong)(uint)(pIVar2->Windows).Size;
    } while (uVar4 != uVar3);
  }
  return;
}

Assistant:

void ImGui::ScaleWindowsInViewport(ImGuiViewportP* viewport, float scale)
{
    ImGuiContext& g = *GImGui;
    if (viewport->Window)
    {
        ScaleWindow(viewport->Window, scale);
    }
    else
    {
        for (int i = 0; i != g.Windows.Size; i++)
            if (g.Windows[i]->Viewport == viewport)
                ScaleWindow(g.Windows[i], scale);
    }
}